

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O0

Bool __thiscall Diligent::ArchiverImpl::AddPipelineState(ArchiverImpl *this,IPipelineState *pPSO)

{
  undefined *puVar1;
  bool bVar2;
  int iVar3;
  ResourceType _Type;
  undefined4 extraout_var;
  Char *Message;
  SerializedPipelineStateImpl *pSVar4;
  undefined8 uVar5;
  IRenderPass *pRP;
  char (*in_R8) [92];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false,_false>,_bool>
  pVar6;
  IRenderPass *pRenderPass;
  undefined1 local_d0 [7];
  bool Res;
  string _msg;
  NamedResourceKey local_a0;
  _Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
  local_88;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false,_false>,_bool>
  it_inserted;
  lock_guard<std::mutex> Guard;
  Char *pCStack_68;
  ResourceType ArchiveResType;
  Char *Name;
  PipelineStateDesc *Desc;
  undefined1 local_48 [8];
  string msg;
  RefCntAutoPtr<Diligent::SerializedPipelineStateImpl> pSerializedPSO;
  IPipelineState *pPSO_local;
  ArchiverImpl *this_local;
  
  if (pPSO == (IPipelineState *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::SerializedPipelineStateImpl> *)((long)&msg.field_2 + 8),
               (IObject *)pPSO,(INTERFACE_ID *)IID_SerializedPipelineState);
    bVar2 = RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>::operator!
                      ((RefCntAutoPtr<Diligent::SerializedPipelineStateImpl> *)
                       ((long)&msg.field_2 + 8));
    if (bVar2) {
      iVar3 = (*(pPSO->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      FormatString<char[17],char_const*,char[45]>
                ((string *)local_48,(Diligent *)"Pipeline state \'",
                 (char (*) [17])CONCAT44(extraout_var,iVar3),
                 (char **)"\' was not created by a serialization device.",(char (*) [45])in_R8);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"AddPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
                 ,0x144);
      std::__cxx11::string::~string((string *)local_48);
      this_local._7_1_ = 0;
      Desc._0_4_ = 1;
    }
    else {
      pSVar4 = RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>::operator->
                         ((RefCntAutoPtr<Diligent::SerializedPipelineStateImpl> *)
                          ((long)&msg.field_2 + 8));
      Name = (Char *)SerializedPipelineStateImpl::GetDesc(pSVar4);
      pCStack_68 = (((PipelineStateDesc *)Name)->super_DeviceObjectAttribs).Name;
      _Type = PipelineTypeToArchiveResourceType(((PipelineStateDesc *)Name)->PipelineType);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)&it_inserted.second,&this->m_PipelinesMtx);
      DeviceObjectArchive::NamedResourceKey::NamedResourceKey(&local_a0,_Type,pCStack_68,true);
      pVar6 = std::
              unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>>>>
              ::
              emplace<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>&>
                        ((unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>>>>
                          *)&this->m_Pipelines,&local_a0,
                         (RefCntAutoPtr<Diligent::SerializedPipelineStateImpl> *)
                         ((long)&msg.field_2 + 8));
      _msg.field_2._8_8_ =
           pVar6.first.
           super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
           ._M_cur;
      it_inserted.first.
      super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
      ._M_cur._0_1_ = pVar6.second;
      local_88._M_cur = (__node_type *)_msg.field_2._8_8_;
      DeviceObjectArchive::NamedResourceKey::~NamedResourceKey(&local_a0);
      if (((byte)it_inserted.first.
                 super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false>
                 ._M_cur & 1) == 0) {
        FormatString<char[27],char_const*,char[92]>
                  ((string *)local_d0,(Diligent *)"Pipeline state with name \'",
                   (char (*) [27])&stack0xffffffffffffff98,
                   (char **)
                   "\' is already present in the archive. All pipelines of the same type must have unique names."
                   ,in_R8);
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar5 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(2,uVar5,0);
        }
        std::__cxx11::string::~string((string *)local_d0);
        this_local._7_1_ = 0;
        Desc._0_4_ = 1;
      }
      else {
        Desc._0_4_ = 0;
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it_inserted.second);
      if ((int)Desc == 0) {
        pRenderPass._7_1_ = true;
        pSVar4 = RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>::operator->
                           ((RefCntAutoPtr<Diligent::SerializedPipelineStateImpl> *)
                            ((long)&msg.field_2 + 8));
        pRP = SerializedPipelineStateImpl::GetRenderPass(pSVar4);
        if (pRP != (IRenderPass *)0x0) {
          pRenderPass._7_1_ = AddRenderPass(this,pRP);
        }
        this_local._7_1_ = pRenderPass._7_1_;
        Desc._0_4_ = 1;
      }
    }
    RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::SerializedPipelineStateImpl> *)((long)&msg.field_2 + 8));
  }
  return (Bool)(this_local._7_1_ & 1);
}

Assistant:

Bool ArchiverImpl::AddPipelineState(IPipelineState* pPSO)
{
    if (pPSO == nullptr)
        return false;

    RefCntAutoPtr<SerializedPipelineStateImpl> pSerializedPSO{pPSO, IID_SerializedPipelineState};
    if (!pSerializedPSO)
    {
        UNEXPECTED("Pipeline state '", pPSO->GetDesc().Name, "' was not created by a serialization device.");
        return false;
    }

    const auto& Desc = pSerializedPSO->GetDesc();
    const auto* Name = Desc.Name;
    // Mesh pipelines are serialized as graphics pipelines
    const auto ArchiveResType = PipelineTypeToArchiveResourceType(Desc.PipelineType);

    {
        std::lock_guard<std::mutex> Guard{m_PipelinesMtx};

        auto it_inserted = m_Pipelines.emplace(NamedResourceKey{ArchiveResType, Name, true}, pSerializedPSO);
        if (!it_inserted.second)
        {
            LOG_ERROR_MESSAGE("Pipeline state with name '", Name, "' is already present in the archive. All pipelines of the same type must have unique names.");
            return false;
        }
    }

    bool Res = true;
    if (auto* pRenderPass = pSerializedPSO->GetRenderPass())
    {
        if (!AddRenderPass(pRenderPass))
            Res = false;
    }

    return Res;
}